

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_compiler.c
# Opt level: O1

void internal_vm_cleanup(gravity_vm *vm)

{
  long *plVar1;
  long lVar2;
  gravity_object_t *obj;
  void *pvVar3;
  gravity_class_t *c;
  long lVar4;
  
  pvVar3 = gravity_vm_getdata(vm);
  for (lVar4 = **(long **)((long)pvVar3 + 0x28); lVar4 != 0; lVar4 = lVar4 + -1) {
    plVar1 = *(long **)((long)pvVar3 + 0x28);
    lVar2 = *plVar1;
    *plVar1 = lVar2 + -1;
    obj = *(gravity_object_t **)(plVar1[2] + -8 + lVar2 * 8);
    if (obj->isa == gravity_class_class) {
      gravity_hash_iterate(obj->htable,internal_free_class,(void *)0x0);
    }
    gravity_object_free(vm,obj);
  }
  return;
}

Assistant:

static void internal_vm_cleanup (gravity_vm *vm) {
    gravity_compiler_t *compiler = (gravity_compiler_t *)gravity_vm_getdata(vm);
    size_t count = marray_size(*compiler->objects);
    for (size_t i=0; i<count; ++i) {
        gravity_object_t *obj = marray_pop(*compiler->objects);
        if (OBJECT_ISA_CLASS(obj)) {
            gravity_class_t *c = (gravity_class_t *)obj;
            gravity_hash_iterate(c->htable, internal_free_class, NULL);
        }
        gravity_object_free(vm, obj);
    }
}